

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQObjectType SVar1;
  HSQUIRRELVM v_00;
  SQObjectPtr *obj;
  SQRESULT SVar2;
  SQInteger SVar3;
  SQTable *in_RDX;
  undefined8 in_RSI;
  SQObjectType type;
  HSQUIRRELVM in_RDI;
  SQFunctionProto *fp;
  SQObjectPtr *self;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  
  type = (SQObjectType)((ulong)in_RSI >> 0x20);
  obj = stack_get(in_stack_ffffffffffffffd0,
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  SVar1 = (obj->super_SQObject)._type;
  if (SVar1 == OT_CLOSURE) {
    v_00 = (HSQUIRRELVM)((obj->super_SQObject)._unVal.pClosure)->_function;
    if ((v_00->temp_reg).super_SQObject._unVal.pTable <= in_RDX) {
      SVar2 = sq_throwerror(v_00,(SQChar *)CONCAT44(0x8000100,in_stack_ffffffffffffffc8));
      return SVar2;
    }
    stack_get(v_00,CONCAT44(0x8000100,in_stack_ffffffffffffffc8));
    SQObjectPtr::operator=((SQObjectPtr *)in_RDX,obj);
  }
  else {
    if (SVar1 != OT_NATIVECLOSURE) {
      SVar3 = sq_aux_invalidtype(in_RDI,type);
      return SVar3;
    }
    if ((SQTable *)((obj->super_SQObject)._unVal.pClosure)->_defaultparams <= in_RDX) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffffd0,
                            (SQChar *)CONCAT44(0x8000200,in_stack_ffffffffffffffc8));
      return SVar2;
    }
    stack_get(in_stack_ffffffffffffffd0,CONCAT44(0x8000200,in_stack_ffffffffffffffc8));
    SQObjectPtr::operator=((SQObjectPtr *)in_RDX,obj);
  }
  SQVM::Pop((SQVM *)0x110ff1);
  return 0;
}

Assistant:

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(sq_type(self))
    {
    case OT_CLOSURE:{
        SQFunctionProto *fp = _closure(self)->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval){
            *(_outer(_closure(self)->_outervalues[nval])->_valptr) = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
                    }
        break;
    case OT_NATIVECLOSURE:
        if(_nativeclosure(self)->_noutervalues > nval){
            _nativeclosure(self)->_outervalues[nval] = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
        break;
    default:
        return sq_aux_invalidtype(v, sq_type(self));
    }
    v->Pop();
    return SQ_OK;
}